

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_code_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::Generate
          (SharedCodeGenerator *this,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_file_list)

{
  FileDescriptor *this_00;
  pointer pcVar1;
  string *psVar2;
  string_view file_name;
  Printer *pPVar3;
  size_t sVar4;
  int iVar5;
  undefined4 extraout_var;
  ZeroCopyOutputStream *output;
  AnnotationCollector *annotation_collector_00;
  Options *in_R8;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view begin_varname;
  string_view text_04;
  string_view text_05;
  string_view annotation_file;
  string_view end_varname;
  string_view java_class_name;
  string classname;
  string filename;
  string java_package;
  string info_full_path;
  string info_relative_path;
  string package_dir;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  Printer *local_268;
  ZeroCopyOutputStream *local_260;
  GeneratorContext *local_258;
  AlphaNum local_250;
  undefined1 local_220 [8];
  AlphaNum *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  AnnotationCollector local_140;
  GeneratedCodeInfo *local_138;
  undefined1 local_130 [8];
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined2 local_e8;
  undefined4 local_e0;
  undefined2 local_dc;
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  undefined2 local_98;
  GeneratedCodeInfo local_90;
  AlphaNum local_60;
  undefined4 extraout_var_00;
  char *pcVar6;
  
  this_00 = this->file_;
  local_dc._0_1_ = (this->options_).opensource_runtime;
  local_dc._1_1_ = (this->options_).annotate_code;
  local_e0._0_1_ = (this->options_).generate_immutable_code;
  local_e0._1_1_ = (this->options_).generate_mutable_code;
  local_e0._2_1_ = (this->options_).generate_shared_code;
  local_e0._3_1_ = (this->options_).enforce_lite;
  pcVar1 = (this->options_).annotation_list_file._M_dataplus._M_p;
  local_258 = context;
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d8,pcVar1,
             pcVar1 + (this->options_).annotation_list_file._M_string_length);
  pcVar1 = (this->options_).output_list_file._M_dataplus._M_p;
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b8,pcVar1,pcVar1 + (this->options_).output_list_file._M_string_length);
  local_98._0_1_ = (this->options_).strip_nonfunctional_codegen;
  local_98._1_1_ = (this->options_).jvm_dsl;
  FileJavaPackage_abi_cxx11_
            (&local_1e0,(java *)this_00,(FileDescriptor *)0x1,SUB81(&local_e0,0),in_R8);
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,local_1e0._M_dataplus._M_p,
             local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
  JavaPackageToDir(&local_160,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((this->options_).enforce_lite == false) {
    ClassNameResolver::GetDescriptorClassName_abi_cxx11_
              ((string *)local_220,
               (this->name_resolver_)._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::ClassNameResolver_*,_false>.
               _M_head_impl,this->file_);
    local_90.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)local_160._M_string_length;
    local_90.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         (intptr_t)local_160._M_dataplus._M_p;
    local_250.piece_._M_len = (size_t)local_218;
    local_250.piece_._M_str = (char *)local_220;
    local_60.piece_._M_len = 5;
    local_60.piece_._M_str = ".java";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_200,(lts_20250127 *)&local_90,&local_250,&local_60,(AlphaNum *)in_R8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(file_list,&local_200);
    iVar5 = (*local_258->_vptr_GeneratorContext[2])();
    local_260 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar5);
    GeneratedCodeInfo::GeneratedCodeInfo(&local_90,(Arena *)0x0);
    local_140._vptr_AnnotationCollector = (_func_int **)&PTR__AnnotationCollector_018f7f90;
    local_138 = &local_90;
    local_268 = (Printer *)operator_new(0x130);
    annotation_collector_00 = &local_140;
    if ((this->options_).annotate_code == false) {
      annotation_collector_00 = (AnnotationCollector *)0x0;
    }
    io::Printer::Printer
              (local_268,(ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar5),'$',
               annotation_collector_00);
    local_250.piece_._M_len = (size_t)local_218;
    local_250.piece_._M_str = (char *)local_220;
    local_60.piece_._M_len = 0xd;
    local_60.piece_._M_str = ".java.pb.meta";
    absl::lts_20250127::StrCat_abi_cxx11_(&local_1a0,(lts_20250127 *)&local_250,&local_60,local_218)
    ;
    local_250.piece_._M_len = local_200._M_string_length;
    local_250.piece_._M_str = local_200._M_dataplus._M_p;
    local_60.piece_._M_len = 8;
    local_60.piece_._M_str = ".pb.meta";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_1c0,(lts_20250127 *)&local_250,&local_60,
               (AlphaNum *)local_200._M_string_length);
    psVar2 = this->file_->name_;
    local_250.piece_._M_str = (psVar2->_M_dataplus)._M_p;
    local_250.piece_._M_len = psVar2->_M_string_length;
    text._M_str = 
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// NO CHECKED-IN PROTOBUF GENCODE\n// source: $filename$\n"
    ;
    text._M_len = 0x74;
    io::Printer::Print<char[9],std::basic_string_view<char,std::char_traits<char>>>
              (local_268,text,(char (*) [9])"filename",&local_250.piece_);
    if ((this->options_).opensource_runtime == true) {
      text_00._M_str = "// Protobuf Java Version: $protobuf_java_version$\n";
      text_00._M_len = 0x32;
      io::Printer::Print<char[22],char[11]>
                (local_268,text_00,(char (*) [22])"protobuf_java_version",
                 (char (*) [11])"4.31.0-dev");
    }
    text_01._M_str = "\n";
    text_01._M_len = 1;
    io::Printer::Print<>(local_268,text_01);
    if (local_1e0._M_string_length != 0) {
      text_02._M_str = "package $package$;\n\n";
      text_02._M_len = 0x14;
      io::Printer::Print<char[8],std::__cxx11::string>
                (local_268,text_02,(char (*) [8])0x139ff93,&local_1e0);
    }
    pPVar3 = local_268;
    local_250.piece_._M_len = (size_t)local_250.digits_;
    if ((this->options_).annotate_code == true) {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,local_1a0._M_dataplus._M_p,
                 local_1a0._M_dataplus._M_p + local_1a0._M_string_length);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_250,anon_var_dwarf_a22956 + 5);
    }
    pcVar6 = local_250.piece_._M_str;
    sVar4 = local_250.piece_._M_len;
    local_130[0] = (this->options_).generate_immutable_code;
    local_130[1] = (this->options_).generate_mutable_code;
    local_130[2] = (this->options_).generate_shared_code;
    local_130[3] = (this->options_).enforce_lite;
    local_130[4] = (this->options_).opensource_runtime;
    local_130[5] = (this->options_).annotate_code;
    local_128._M_p = (pointer)&local_118;
    pcVar1 = (this->options_).annotation_list_file._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,pcVar1,
               pcVar1 + (this->options_).annotation_list_file._M_string_length);
    pcVar1 = (this->options_).output_list_file._M_dataplus._M_p;
    local_108._M_p = (pointer)&local_f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar1,
               pcVar1 + (this->options_).output_list_file._M_string_length);
    local_e8._0_1_ = (this->options_).strip_nonfunctional_codegen;
    local_e8._1_1_ = (this->options_).jvm_dsl;
    annotation_file._M_str = (char *)sVar4;
    annotation_file._M_len = (size_t)pcVar6;
    PrintGeneratedAnnotation(pPVar3,'$',annotation_file,(Options *)local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_p != &local_f8) {
      operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_p != &local_118) {
      operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
    }
    if ((char *)local_250.piece_._M_len != local_250.digits_) {
      operator_delete((void *)local_250.piece_._M_len,local_250.digits_._0_8_ + 1);
    }
    text_03._M_str =
         "public final class $classname$ {\n  /* This variable is to be called by generated code only. It returns\n  * an incomplete descriptor for internal use only. */\n  public static final com.google.protobuf.Descriptors.FileDescriptor\n      descriptor;\n"
    ;
    text_03._M_len = 0xf5;
    io::Printer::Print<char[10],std::__cxx11::string>
              (local_268,text_03,(char (*) [10])0x13005f3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220);
    psVar2 = this->file_->name_;
    local_250.piece_._M_str = (psVar2->_M_dataplus)._M_p;
    local_250.piece_._M_len = psVar2->_M_string_length;
    file_name._M_str = local_250.piece_._M_str;
    file_name._M_len = local_250.piece_._M_len;
    begin_varname._M_str = "classname";
    begin_varname._M_len = 9;
    end_varname._M_str = "classname";
    end_varname._M_len = 9;
    pcVar6 = "classname";
    io::Printer::Annotate
              (local_268,begin_varname,end_varname,file_name,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    text_04._M_str = "  static {\n";
    text_04._M_len = 0xb;
    io::Printer::Print<>(local_268,text_04);
    local_268->indent_ = local_268->indent_ + (local_268->options_).spaces_per_indent * 2;
    GenerateDescriptors(this,local_268);
    java_class_name._M_str = pcVar6;
    java_class_name._M_len = (size_t)local_220;
    PrintGencodeVersionValidator
              ((java *)local_268,(Printer *)(ulong)(this->options_).opensource_runtime,
               (bool)local_218._0_1_,java_class_name);
    io::Printer::Outdent(local_268);
    io::Printer::Outdent(local_268);
    text_05._M_str = "  }\n}\n";
    text_05._M_len = 6;
    io::Printer::Print<>(local_268,text_05);
    if ((this->options_).annotate_code == true) {
      iVar5 = (*local_258->_vptr_GeneratorContext[2])(local_258,&local_1c0);
      output = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar5);
      MessageLite::SerializeToZeroCopyStream((MessageLite *)&local_90,output);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(annotation_file_list,&local_1c0);
      if (output != (ZeroCopyOutputStream *)0x0) {
        (*output->_vptr_ZeroCopyOutputStream[1])(output);
      }
    }
    pPVar3 = local_268;
    local_268 = (Printer *)0x0;
    if (pPVar3 != (Printer *)0x0) {
      std::default_delete<google::protobuf::io::Printer>::operator()
                ((default_delete<google::protobuf::io::Printer> *)&local_268,pPVar3);
    }
    if (local_260 != (ZeroCopyOutputStream *)0x0) {
      (*local_260->_vptr_ZeroCopyOutputStream[1])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
      operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
    }
    if (local_268 != (Printer *)0x0) {
      std::default_delete<google::protobuf::io::Printer>::operator()
                ((default_delete<google::protobuf::io::Printer> *)&local_268,local_268);
    }
    GeneratedCodeInfo::~GeneratedCodeInfo(&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if (local_220 != (undefined1  [8])&local_210) {
      operator_delete((void *)local_220,local_210._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SharedCodeGenerator::Generate(
    GeneratorContext* context, std::vector<std::string>* file_list,
    std::vector<std::string>* annotation_file_list) {
  std::string java_package = FileJavaPackage(file_, true, options_);
  std::string package_dir = JavaPackageToDir(java_package);

  if (HasDescriptorMethods(file_, options_.enforce_lite)) {
    // Generate descriptors.
    std::string classname = name_resolver_->GetDescriptorClassName(file_);
    std::string filename = absl::StrCat(package_dir, classname, ".java");
    file_list->push_back(filename);
    std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    std::unique_ptr<io::Printer> printer(new io::Printer(
        output.get(), '$',
        options_.annotate_code ? &annotation_collector : nullptr));
    std::string info_relative_path = absl::StrCat(classname, ".java.pb.meta");
    std::string info_full_path = absl::StrCat(filename, ".pb.meta");
    printer->Print(
        "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
        "// NO CHECKED-IN PROTOBUF "
        // Intentional line breaker
        "GENCODE\n"
        "// source: $filename$\n",
        "filename", file_->name());
    if (options_.opensource_runtime) {
      printer->Print("// Protobuf Java Version: $protobuf_java_version$\n",
                     "protobuf_java_version", PROTOBUF_JAVA_VERSION_STRING);
    }
    printer->Print("\n");
    if (!java_package.empty()) {
      printer->Print(
          "package $package$;\n"
          "\n",
          "package", java_package);
    }
    PrintGeneratedAnnotation(printer.get(), '$',
                             options_.annotate_code ? info_relative_path : "",
                             options_);


    printer->Print(

        "public final class $classname$ {\n"
        "  /* This variable is to be called by generated code only. It "
        "returns\n"
        "  * an incomplete descriptor for internal use only. */\n"
        "  public static final com.google.protobuf.Descriptors.FileDescriptor\n"
        "      descriptor;\n",
        "classname", classname);
    printer->Annotate("classname", file_->name());


    printer->Print("  static {\n");
    printer->Indent();
    printer->Indent();
    GenerateDescriptors(printer.get());
    PrintGencodeVersionValidator(printer.get(), options_.opensource_runtime,
                                 classname);
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");

    if (options_.annotate_code) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
      annotation_file_list->push_back(info_full_path);
    }

    printer.reset();
    output.reset();
  }
}